

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_aug.c
# Opt level: O3

int do_zlib(zbuf *a,char *obuf,int olen,int exp,int parse_header)

{
  zhuffman *z;
  char cVar1;
  char *pcVar2;
  uint8 *puVar3;
  ulong uVar4;
  int iVar5;
  char *pcVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  long lVar10;
  uint uVar11;
  byte *pbVar12;
  uint8 uVar13;
  ulong uVar14;
  uint8 *puVar15;
  ulong uVar16;
  uint uVar17;
  uint32 uVar18;
  uint32 uVar19;
  uint num;
  ulong uVar20;
  int iVar21;
  size_t __n;
  uint8 lencodes [455];
  byte local_218 [31];
  byte local_1f9;
  undefined2 local_1f8;
  ushort local_1f6;
  
  a->zout_start = obuf;
  a->zout = obuf;
  a->zout_end = obuf + olen;
  a->z_expandable = exp;
  if (parse_header != 0) {
    pbVar12 = a->zbuffer;
    uVar7 = 0;
    if (pbVar12 < a->zbuffer_end) {
      a->zbuffer = pbVar12 + 1;
      uVar17 = (uint)*pbVar12;
      pbVar12 = pbVar12 + 1;
    }
    else {
      uVar17 = 0;
    }
    if (pbVar12 < a->zbuffer_end) {
      a->zbuffer = pbVar12 + 1;
      uVar7 = (uint)*pbVar12;
    }
    if ((((uVar7 & 0x20) != 0) ||
        (uVar7 = uVar7 | uVar17 << 8, uVar11 = uVar7 * 0x843 >> 0x10,
        uVar11 = ((uVar7 - uVar11 & 0xffff) >> 1) + uVar11 >> 4,
        (short)(((short)uVar11 - (short)(uVar11 << 5)) + (short)uVar7) != 0)) ||
       ((uVar17 & 0xf) != 8)) {
LAB_0014a58c:
      failure_reason = "Corrupt PNG";
      return 0;
    }
  }
  a->num_bits = 0;
  a->code_buffer = 0;
  z = &a->z_length;
  iVar21 = 0;
  do {
    if (iVar21 < 1) {
      fill_bits(a);
      iVar21 = a->num_bits;
    }
    uVar7 = a->code_buffer;
    uVar18 = uVar7 >> 1;
    a->code_buffer = uVar18;
    iVar8 = iVar21 + -1;
    a->num_bits = iVar8;
    if (iVar21 < 3) {
      fill_bits(a);
      iVar8 = a->num_bits;
      uVar18 = a->code_buffer;
    }
    uVar19 = uVar18 >> 2;
    a->code_buffer = uVar19;
    uVar17 = iVar8 - 2;
    a->num_bits = uVar17;
    iVar21 = 0;
    switch(uVar18 & 3) {
    case 0:
      if ((uVar17 & 7) != 0) {
        zreceive(a,uVar17 & 7);
        uVar17 = a->num_bits;
      }
      if ((int)uVar17 < 1) {
        if (uVar17 != 0) goto LAB_0014a5d4;
        uVar20 = 0;
LAB_0014a4f5:
        puVar15 = a->zbuffer;
        puVar3 = a->zbuffer_end;
        do {
          if (puVar15 < puVar3) {
            a->zbuffer = puVar15 + 1;
            uVar13 = *puVar15;
            puVar15 = puVar15 + 1;
          }
          else {
            uVar13 = '\0';
          }
          *(uint8 *)((long)&local_1f8 + uVar20) = uVar13;
          uVar20 = uVar20 + 1;
        } while (uVar20 != 4);
      }
      else {
        uVar11 = uVar17 - 1 >> 3;
        uVar20 = (ulong)(uVar11 + 1);
        uVar16 = 0xffffffffffffffff;
        uVar4 = (ulong)a->code_buffer;
        do {
          uVar14 = uVar4;
          *(char *)((long)&local_1f8 + uVar16 + 1) = (char)uVar14;
          uVar16 = uVar16 + 1;
          uVar4 = uVar14 >> 8;
        } while (uVar11 != uVar16);
        a->code_buffer = (uint32)(uVar14 >> 8);
        iVar21 = (uVar17 - 8) - (uVar17 - 1 & 0xfffffff8);
        a->num_bits = iVar21;
        if (iVar21 != 0) {
LAB_0014a5d4:
          __assert_fail("a->num_bits == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sidneydijkstra[P]SDEN/external/soil/src/stb_image_aug.c"
                        ,0x752,"int parse_uncompressed_block(zbuf *)");
        }
        if (uVar16 < 3) goto LAB_0014a4f5;
      }
      if ((local_1f6 ^ local_1f8) == 0xffff) {
        puVar15 = a->zbuffer;
        uVar20 = (ulong)local_1f8;
        if (puVar15 + uVar20 <= a->zbuffer_end) {
          pcVar6 = a->zout;
          if (a->zout_end < pcVar6 + uVar20) {
            iVar21 = expand(a,(uint)local_1f8);
            if (iVar21 == 0) {
              return 0;
            }
            puVar15 = a->zbuffer;
            pcVar6 = a->zout;
          }
          memcpy(pcVar6,puVar15,uVar20);
          a->zbuffer = a->zbuffer + uVar20;
          a->zout = a->zout + uVar20;
          goto LAB_0014a576;
        }
      }
      goto LAB_0014a58c;
    case 1:
      if (default_distance[0x1f] == '\0') {
        memset(default_length,8,0x90);
        builtin_memcpy(default_length + 0x90,
                       "\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\b\b\b\b\b\b\b\b"
                       ,0x90);
        builtin_memcpy(default_distance,
                       "\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05"
                       ,0x20);
      }
      iVar21 = zbuild_huffman(z,default_length,0x120);
      if (iVar21 == 0) {
        return 0;
      }
      puVar15 = default_distance;
      iVar21 = 0x20;
      break;
    case 2:
      if (iVar8 < 7) {
        fill_bits(a);
        uVar17 = a->num_bits;
        uVar19 = a->code_buffer;
      }
      uVar11 = uVar19 >> 5;
      a->code_buffer = uVar11;
      iVar21 = uVar17 - 5;
      a->num_bits = iVar21;
      if ((int)uVar17 < 10) {
        fill_bits(a);
        iVar21 = a->num_bits;
        uVar11 = a->code_buffer;
      }
      uVar17 = uVar11 >> 5;
      a->code_buffer = uVar17;
      iVar8 = iVar21 + -5;
      a->num_bits = iVar8;
      if (iVar21 < 9) {
        fill_bits(a);
        iVar8 = a->num_bits;
        uVar17 = a->code_buffer;
      }
      num = (uVar19 & 0x1f) + 0x101;
      iVar21 = (uVar11 & 0x1f) + 1;
      uVar11 = uVar17 >> 4;
      a->code_buffer = uVar11;
      iVar8 = iVar8 + -4;
      a->num_bits = iVar8;
      local_218[0] = 0;
      local_218[1] = 0;
      local_218[2] = 0;
      local_218[3] = 0;
      local_218[4] = 0;
      local_218[5] = 0;
      local_218[6] = 0;
      local_218[7] = 0;
      local_218[8] = 0;
      local_218[9] = 0;
      local_218[10] = 0;
      local_218[0xb] = 0;
      local_218[0xc] = 0;
      local_218[0xd] = 0;
      local_218[0xe] = 0;
      local_218[0xf] = 0;
      local_218[0x10] = 0;
      local_218[0x11] = 0;
      local_218[0x12] = 0;
      uVar20 = 0;
      do {
        uVar9 = uVar11;
        if (iVar8 < 3) {
          fill_bits(a);
          iVar8 = a->num_bits;
          uVar9 = a->code_buffer;
        }
        uVar11 = uVar9 >> 3;
        a->code_buffer = uVar11;
        iVar8 = iVar8 + -3;
        a->num_bits = iVar8;
        local_218[(byte)(&compute_huffman_codes_length_dezigzag)[uVar20]] = (byte)uVar9 & 7;
        uVar20 = uVar20 + 1;
      } while ((uVar17 & 0xf) + 4 != uVar20);
      iVar8 = zbuild_huffman((zhuffman *)compute_huffman_codes_z_codelength,local_218,0x13);
      if (iVar8 == 0) {
        return 0;
      }
      iVar8 = 0;
      do {
        uVar17 = zhuffman_decode(a,(zhuffman *)compute_huffman_codes_z_codelength);
        if (0x12 < uVar17) {
          __assert_fail("c >= 0 && c < 19",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sidneydijkstra[P]SDEN/external/soil/src/stb_image_aug.c"
                        ,0x72d,"int compute_huffman_codes(zbuf *)");
        }
        if (uVar17 < 0x10) {
          lVar10 = (long)iVar8;
          iVar8 = iVar8 + 1;
          *(char *)((long)&local_1f8 + lVar10) = (char)uVar17;
        }
        else {
          iVar5 = a->num_bits;
          if (uVar17 == 0x11) {
            if (iVar5 < 3) {
              fill_bits(a);
              iVar5 = a->num_bits;
            }
            uVar17 = a->code_buffer;
            a->code_buffer = uVar17 >> 3;
            a->num_bits = iVar5 + -3;
            __n = (ulong)(uVar17 & 7) + 3;
LAB_0014a348:
            uVar17 = 0;
          }
          else {
            if (uVar17 != 0x10) {
              if (iVar5 < 7) {
                fill_bits(a);
                iVar5 = a->num_bits;
              }
              uVar17 = a->code_buffer;
              a->code_buffer = uVar17 >> 7;
              a->num_bits = iVar5 + -7;
              __n = (ulong)(uVar17 & 0x7f) + 0xb;
              goto LAB_0014a348;
            }
            if (iVar5 < 2) {
              fill_bits(a);
              iVar5 = a->num_bits;
            }
            uVar17 = a->code_buffer;
            a->code_buffer = uVar17 >> 2;
            a->num_bits = iVar5 + -2;
            __n = (ulong)(uVar17 & 3) + 3;
            uVar17 = (uint)(&local_1f9)[iVar8];
          }
          memset((void *)((long)&local_1f8 + (long)iVar8),uVar17,__n);
          iVar8 = iVar8 + (int)__n;
        }
      } while (iVar8 < (int)(iVar21 + num));
      if (iVar8 != iVar21 + num) goto LAB_0014a58c;
      iVar8 = zbuild_huffman(z,(uint8 *)&local_1f8,num);
      if (iVar8 == 0) {
        return 0;
      }
      puVar15 = (uint8 *)((long)&local_1f8 + (ulong)num);
      break;
    case 3:
      goto switchD_0014a03e_caseD_3;
    }
    iVar21 = zbuild_huffman(&a->z_distance,puVar15,iVar21);
    if (iVar21 == 0) {
      return 0;
    }
    while( true ) {
      while (iVar21 = zhuffman_decode(a,z), iVar21 < 0x100) {
        if (iVar21 < 0) goto LAB_0014a58c;
        pcVar6 = a->zout;
        if (a->zout_end <= pcVar6) {
          iVar8 = expand(a,1);
          if (iVar8 == 0) {
            return 0;
          }
          pcVar6 = a->zout;
        }
        a->zout = pcVar6 + 1;
        *pcVar6 = (char)iVar21;
      }
      if (iVar21 == 0x100) break;
      uVar20 = (ulong)(iVar21 - 0x101);
      iVar21 = length_base[uVar20];
      if (0xffffffffffffffeb < uVar20 - 0x1c) {
        uVar17 = zreceive(a,length_extra[uVar20]);
        iVar21 = iVar21 + uVar17;
      }
      uVar17 = zhuffman_decode(a,&a->z_distance);
      if ((int)uVar17 < 0) goto LAB_0014a58c;
      uVar20 = (ulong)uVar17;
      iVar8 = dist_base[uVar20];
      if (0xffffffffffffffe5 < uVar20 - 0x1e) {
        uVar17 = zreceive(a,dist_extra[uVar20]);
        iVar8 = iVar8 + uVar17;
      }
      pcVar6 = a->zout;
      if ((long)pcVar6 - (long)a->zout_start < (long)iVar8) goto LAB_0014a58c;
      if (a->zout_end < pcVar6 + iVar21) {
        iVar5 = expand(a,iVar21);
        if (iVar5 == 0) {
          return 0;
        }
        pcVar6 = a->zout;
      }
      if (iVar21 != 0) {
        lVar10 = 0;
        do {
          cVar1 = pcVar6[lVar10 - iVar8];
          pcVar2 = a->zout;
          a->zout = pcVar2 + 1;
          *pcVar2 = cVar1;
          lVar10 = lVar10 + 1;
        } while (iVar21 != (int)lVar10);
      }
    }
LAB_0014a576:
    if ((uVar7 & 1) != 0) {
      iVar21 = 1;
switchD_0014a03e_caseD_3:
      return iVar21;
    }
    iVar21 = a->num_bits;
  } while( true );
}

Assistant:

static int do_zlib(zbuf *a, char *obuf, int olen, int exp, int parse_header)
{
   a->zout_start = obuf;
   a->zout       = obuf;
   a->zout_end   = obuf + olen;
   a->z_expandable = exp;

   return parse_zlib(a, parse_header);
}